

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
sequence<toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>
::invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc,
          region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *reg,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               first)

{
  bool bVar1;
  value_type *other;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined4 local_98;
  failure_type local_81;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_80
  ;
  undefined1 local_78 [8];
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *reg_local;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *loc_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>
  ::invoke<std::__cxx11::string>
            ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)local_78,
             (repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)25>,toml::detail::character<(char)39>>>,toml::detail::unlimited>
              *)this,loc);
  bVar1 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
          ::is_err((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                    *)local_78);
  if (bVar1) {
    local_80 = reg;
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this,(const_iterator)reg);
    none();
    result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
    ::result(__return_storage_ptr__,&local_81);
  }
  else {
    other = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_78);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator+=((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)loc,other);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::region
              ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_e0,
               (region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)loc);
    sequence<toml::detail::character<(char)39>>::
    invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,(sequence<toml::detail::character<(char)39>> *)this,&local_e0,
               reg,first);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_e0);
  }
  local_98 = 1;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  ::~result((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
             *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }